

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall
Graph::createCapacitorType(Graph *this,int id,double reactive_power,double cost_per_KVAr,int step)

{
  const_iterator __position;
  ostream *poVar1;
  Capacitor local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Capacitor Created with pot: ",0x1c);
  poVar1 = std::ostream::_M_insert<double>(reactive_power / (this->PB * 1000.0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  __position._M_current =
       (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
       super__Vector_impl_data._M_start;
  Capacitor::Capacitor
            (&local_48,id,reactive_power / (this->PB * 1000.0),cost_per_KVAr * reactive_power,0);
  std::vector<Capacitor,_std::allocator<Capacitor>_>::_M_insert_rval
            (&this->capacitorType,__position,&local_48);
  if (local_48.powerSteps.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.powerSteps.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Graph::createCapacitorType(int id, double reactive_power, double cost_per_KVAr, int step){
    cout << "Capacitor Created with pot: " << reactive_power/(PB*1000) << endl;
    double cost = cost_per_KVAr * reactive_power;
    this->capacitorType.insert( this->capacitorType.begin(), Capacitor( id, reactive_power/(PB*1000), cost ) );
}